

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  u8 *puVar1;
  byte bVar2;
  u16 uVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  sqlite3 *db;
  Schema *pSVar7;
  Column *pCVar8;
  i16 *piVar9;
  i16 *piVar10;
  u8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Table *pTVar15;
  char *zName;
  Index *pIVar16;
  Table *pTVar17;
  Expr *pEVar18;
  size_t sVar19;
  Expr *pEVar20;
  ExprList_item *pEVar21;
  CollSeq *pCVar22;
  ulong uVar23;
  Index *pIVar24;
  void *pvVar25;
  Vdbe *p;
  Schema **ppSVar26;
  Index *pIVar27;
  Op *pOVar28;
  Db *pDVar29;
  ulong uVar30;
  Bitmask BVar31;
  long lVar32;
  char *pcVar33;
  char *pcVar34;
  short *psVar35;
  ulong uVar36;
  uint uVar37;
  ExprList_item *pEVar38;
  bool bVar39;
  int local_d8;
  char *local_d0;
  ExprList *local_c0;
  char *zExtra;
  Token *pName;
  long local_80;
  Token *local_78;
  Token prevCol;
  DbFixer sFix;
  
  db = pParse->db;
  zName = (char *)0x0;
  pName = (Token *)0x0;
  zExtra = (char *)0x0;
  if (db->mallocFailed != '\0') goto LAB_0015cbe2;
  if ((pParse->nErr < 1) &&
     (((idxType == '\x02' || (pParse->eParseMode != '\x01')) &&
      (iVar12 = sqlite3ReadSchema(pParse), iVar12 == 0)))) {
    if (pTblName != (SrcList *)0x0) {
      iVar12 = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
      if (-1 < iVar12) {
        if ((((db->init).busy == '\0') &&
            (pTVar15 = sqlite3SrcListLookup(pParse,pTblName),
            pTVar15 != (Table *)0x0 && pName2->n == 0)) && (pTVar15->pSchema == db->aDb[1].pSchema))
        {
          iVar12 = 1;
        }
        pDVar29 = pParse->db->aDb;
        sFix.zDb = pDVar29[iVar12].zDbSName;
        sFix.pSchema = pDVar29[iVar12].pSchema;
        sFix.zType = "index";
        sFix.pName = pName;
        sFix.bVarOnly = (int)(iVar12 == 1);
        sFix.pParse = pParse;
        sqlite3FixSrcList(&sFix,pTblName);
        zName = (char *)0x0;
        pTVar15 = sqlite3LocateTableItem(pParse,0,pTblName->a);
        if (pTVar15 != (Table *)0x0) {
          if ((iVar12 != 1) || (db->aDb[1].pSchema == pTVar15->pSchema)) {
            if ((pTVar15->tabFlags & 0x20) == 0) goto LAB_0015cdcc;
            for (pIVar27 = pTVar15->pIndex;
                (pIVar27 != (Index *)0x0 && ((*(ushort *)&pIVar27->field_0x63 & 3) != 2));
                pIVar27 = pIVar27->pNext) {
            }
            goto LAB_0015cdcf;
          }
          pcVar34 = pTVar15->zName;
          pcVar33 = "cannot create a TEMP index on non-TEMP table \"%s\"";
          goto LAB_0015ce3f;
        }
        goto LAB_0015cbe2;
      }
      goto LAB_0015cbdf;
    }
    pTVar15 = pParse->pNewTable;
    if (pTVar15 == (Table *)0x0) goto LAB_0015cbdf;
    if (pTVar15->pSchema == (Schema *)0x0) {
      iVar12 = -1000000;
LAB_0015cdcc:
      pIVar27 = (Index *)0x0;
    }
    else {
      iVar12 = -1;
      pIVar27 = (Index *)0x0;
      ppSVar26 = &db->aDb->pSchema;
      do {
        iVar12 = iVar12 + 1;
        pSVar7 = *ppSVar26;
        ppSVar26 = ppSVar26 + 4;
      } while (pSVar7 != pTVar15->pSchema);
    }
LAB_0015cdcf:
    local_80 = (long)iVar12 * 0x20;
    pDVar29 = db->aDb + iVar12;
    pcVar34 = pTVar15->zName;
    iVar13 = sqlite3_strnicmp(pcVar34,"sqlite_",7);
    if (((iVar13 == 0) && (pTblName != (SrcList *)0x0)) && ((db->init).busy == '\0')) {
      pcVar33 = "table %s may not be indexed";
LAB_0015ce3f:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar33,pcVar34);
      goto LAB_0015cbe2;
    }
    if (pTVar15->pSelect == (Select *)0x0) {
      if (pTVar15->nModuleArg != 0) {
        pcVar34 = "virtual tables may not be indexed";
        goto LAB_0015ce58;
      }
      local_78 = pName;
      if (pName == (Token *)0x0) {
        for (pIVar16 = pTVar15->pIndex; pIVar16 != (Index *)0x0; pIVar16 = pIVar16->pNext) {
        }
        pIVar16 = (Index *)0x0;
        zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",pcVar34);
        if (zName == (char *)0x0) goto LAB_0015cbe4;
        if (pParse->eParseMode != '\0') {
          zName[7] = zName[7] + '\x01';
        }
        goto LAB_0015cf5f;
      }
      zName = sqlite3NameFromToken(db,pName);
      if (zName == (char *)0x0) goto LAB_0015cbdf;
      iVar13 = sqlite3CheckObjectName(pParse,zName);
      if (iVar13 != 0) goto LAB_0015cbe2;
      if (pParse->eParseMode < 2) {
        if (((db->init).busy == '\0') &&
           (pTVar17 = sqlite3FindTable(db,zName,(char *)0x0), pTVar17 != (Table *)0x0)) {
          pcVar34 = "there is already a table named %s";
        }
        else {
          pIVar16 = sqlite3FindIndex(db,zName,pDVar29->zDbSName);
          if (pIVar16 == (Index *)0x0) goto LAB_0015cf5f;
          if (ifNotExist != 0) {
            sqlite3CodeVerifySchema(pParse,iVar12);
            goto LAB_0015cbe2;
          }
          pcVar34 = "index %s already exists";
        }
        pIVar16 = (Index *)0x0;
        sqlite3ErrorMsg(pParse,pcVar34,zName);
        goto LAB_0015cbe4;
      }
LAB_0015cf5f:
      if (pParse->eParseMode < 2) {
        pcVar34 = pDVar29->zDbSName;
        pcVar33 = "sqlite_master";
        if (iVar12 == 1) {
          pcVar33 = "sqlite_temp_master";
        }
        pIVar16 = (Index *)0x0;
        iVar13 = sqlite3AuthCheck(pParse,0x12,pcVar33,(char *)0x0,pcVar34);
        if (iVar13 != 0) goto LAB_0015cbe4;
        iVar13 = sqlite3AuthCheck(pParse,(uint)(iVar12 == 1) * 2 + 1,zName,pTVar15->zName,pcVar34);
        if (iVar13 != 0) goto LAB_0015cbe2;
      }
      if (pList == (ExprList *)0x0) {
        pCVar8 = pTVar15->aCol;
        sVar4 = pTVar15->nCol;
        puVar1 = &pCVar8[(long)sVar4 + -1].colFlags;
        *puVar1 = *puVar1 | 8;
        prevCol.z = pCVar8[(long)sVar4 + -1].zName;
        if (prevCol.z == (char *)0x0) {
          prevCol.n = 0;
        }
        else {
          sVar19 = strlen(prevCol.z);
          prevCol.n = (uint)sVar19 & 0x3fffffff;
        }
        pEVar18 = sqlite3ExprAlloc(db,0x3b,&prevCol,0);
        pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar18);
        if (-1 < sortOrder && pList != (ExprList *)0x0) {
          pList->a[(long)pList->nExpr + -1].sortOrder = (u8)sortOrder;
        }
        if (pList != (ExprList *)0x0) goto LAB_0015d0cc;
      }
      else {
        if (pParse->db->aLimit[2] < pList->nExpr) {
          sqlite3ErrorMsg(pParse,"too many columns in %s","index");
        }
        if (pParse->nErr == 0) {
LAB_0015d0cc:
          iVar13 = pList->nExpr;
          uVar3 = 1;
          local_d8 = 1;
          if (0 < (long)iVar13) {
            lVar32 = 0;
            local_d8 = 0;
            do {
              pcVar34 = *(char **)((long)&pList->a[0].pExpr + lVar32);
              if (*pcVar34 == 'j') {
                pcVar34 = *(char **)(pcVar34 + 8);
                if (pcVar34 == (char *)0x0) {
                  iVar14 = 1;
                }
                else {
                  sVar19 = strlen(pcVar34);
                  iVar14 = ((uint)sVar19 & 0x3fffffff) + 1;
                }
                local_d8 = local_d8 + iVar14;
              }
              lVar32 = lVar32 + 0x20;
            } while ((long)iVar13 << 5 != lVar32);
            local_d8 = local_d8 + 1;
          }
          sVar19 = strlen(zName);
          uVar37 = (uint)sVar19 & 0x3fffffff;
          if (pIVar27 != (Index *)0x0) {
            uVar3 = pIVar27->nKeyCol;
          }
          pIVar16 = sqlite3AllocateIndexObject(db,(short)iVar13 + uVar3,local_d8 + uVar37,&zExtra);
          pcVar34 = zExtra;
          if (db->mallocFailed != '\0') goto LAB_0015cbe4;
          pIVar16->zName = zExtra;
          pcVar33 = zExtra + (ulong)uVar37 + 1;
          zExtra = pcVar33;
          memcpy(pcVar34,zName,(ulong)uVar37 + 1);
          pIVar16->pTable = pTVar15;
          pIVar16->onError = (u8)onError;
          *(ushort *)&pIVar16->field_0x63 =
               (ushort)(idxType & 3) + (ushort)(onError != 0) * 8 |
               *(ushort *)&pIVar16->field_0x63 & 0xfff4;
          pIVar16->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_80);
          pIVar16->nKeyCol = (u16)pList->nExpr;
          if (pPIWhere != (Expr *)0x0) {
            sqlite3ResolveSelfReference(pParse,pTVar15,2,pPIWhere,(ExprList *)0x0);
            pIVar16->pPartIdxWhere = pPIWhere;
          }
          bVar2 = pDVar29->pSchema->file_format;
          local_c0 = pList;
          if (1 < pParse->eParseMode) {
            pIVar16->aColExpr = pList;
            local_c0 = (ExprList *)0x0;
          }
          if (pIVar16->nKeyCol == 0) {
            uVar30 = 0;
          }
          else {
            pEVar38 = pList->a;
            uVar30 = 0;
            do {
              pEVar18 = pEVar38->pExpr;
              pEVar20 = pEVar18;
              if ((pEVar18->op == 'n') ||
                 ((pEVar18->op == 'j' && (pEVar20 = pEVar18->pLeft, pEVar20->op == 'n')))) {
                pEVar20->op = ';';
              }
              sqlite3ResolveSelfReference(pParse,pTVar15,0x20,pEVar18,(ExprList *)0x0);
              pEVar21 = pEVar38;
              if (pParse->nErr == 0) {
                while ((pEVar18 = pEVar21->pExpr, pEVar18 != (Expr *)0x0 &&
                       ((pEVar18->flags >> 0xc & 1) != 0))) {
                  if ((pEVar18->flags >> 0x12 & 1) == 0) {
                    pEVar21 = (ExprList_item *)&pEVar18->pLeft;
                  }
                  else {
                    pEVar21 = ((pEVar18->x).pList)->a;
                  }
                }
                if (pEVar18->op == 0xa2) {
                  uVar37 = (uint)pEVar18->iColumn;
                  if (pEVar18->iColumn < 0) {
                    uVar37 = (uint)pTVar15->iPKey;
                  }
                  else if (pTVar15->aCol[uVar37].notNull == '\0') {
                    pIVar16->field_0x63 = pIVar16->field_0x63 & 0xf7;
                  }
                  pIVar16->aiColumn[uVar30] = (i16)uVar37;
LAB_0015d3a7:
                  if (pEVar38->pExpr->op == 'j') {
                    pcVar34 = (pEVar38->pExpr->u).zToken;
                    if (pcVar34 == (char *)0x0) {
                      sVar19 = 1;
                    }
                    else {
                      sVar19 = strlen(pcVar34);
                      sVar19 = (ulong)((uint)sVar19 & 0x3fffffff) + 1;
                    }
                    memcpy(pcVar33,pcVar34,sVar19);
                    zExtra = pcVar33 + sVar19;
                    pcVar34 = pcVar33;
                    pcVar33 = zExtra;
                  }
                  else if ((int)uVar37 < 0) {
                    pcVar34 = (char *)0x0;
                  }
                  else {
                    pcVar34 = pTVar15->aCol[uVar37].zColl;
                  }
                  if (pcVar34 == (char *)0x0) {
                    pcVar34 = "BINARY";
                  }
                  if (((db->init).busy == '\0') &&
                     (pCVar22 = sqlite3LocateCollSeq(pParse,pcVar34), pCVar22 == (CollSeq *)0x0))
                  goto LAB_0015d2eb;
                  uVar11 = '\0';
                  pIVar16->azColl[uVar30] = pcVar34;
                  if (3 < bVar2) {
                    uVar11 = (u8)*(undefined4 *)&pEVar38->sortOrder;
                  }
                  pIVar16->aSortOrder[uVar30] = uVar11;
                  bVar39 = true;
                }
                else {
                  if (pTVar15 != pParse->pNewTable) {
                    if (pIVar16->aColExpr == (ExprList *)0x0) {
                      pIVar16->aColExpr = local_c0;
                      local_c0 = (ExprList *)0x0;
                    }
                    pIVar16->aiColumn[uVar30] = -2;
                    pIVar16->field_0x63 = pIVar16->field_0x63 & 0xf7;
                    uVar37 = 0xfffffffe;
                    goto LAB_0015d3a7;
                  }
                  sqlite3ErrorMsg(pParse,
                                  "expressions prohibited in PRIMARY KEY and UNIQUE constraints");
                  bVar39 = false;
                }
              }
              else {
LAB_0015d2eb:
                bVar39 = false;
              }
              if (!bVar39) goto LAB_0015d8d7;
              uVar30 = uVar30 + 1;
              pEVar38 = pEVar38 + 1;
            } while (uVar30 < pIVar16->nKeyCol);
          }
          if (pIVar27 == (Index *)0x0) {
            pIVar16->aiColumn[uVar30 & 0xffffffff] = -1;
            pIVar16->azColl[uVar30 & 0xffffffff] = "BINARY";
          }
          else if (pIVar27->nKeyCol != 0) {
            uVar23 = 0;
            do {
              uVar37 = (uint)pIVar16->nKeyCol;
              psVar35 = pIVar16->aiColumn;
              do {
                if ((int)uVar37 < 1) {
                  iVar13 = (int)uVar30;
                  pIVar16->aiColumn[iVar13] = pIVar27->aiColumn[uVar23];
                  pIVar16->azColl[iVar13] = pIVar27->azColl[uVar23];
                  pIVar16->aSortOrder[iVar13] = pIVar27->aSortOrder[uVar23];
                  uVar30 = (ulong)(iVar13 + 1);
                  goto LAB_0015d57e;
                }
                uVar37 = uVar37 - 1;
                sVar4 = *psVar35;
                psVar35 = psVar35 + 1;
              } while (sVar4 != pIVar27->aiColumn[uVar23]);
              pIVar16->nColumn = pIVar16->nColumn - 1;
LAB_0015d57e:
              uVar23 = uVar23 + 1;
            } while (uVar23 < pIVar27->nKeyCol);
          }
          sqlite3DefaultRowEst(pIVar16);
          if (pParse->pNewTable == (Table *)0x0) {
            estimateIndexWidth(pIVar16);
          }
          uVar5 = pIVar16->nColumn;
          uVar30 = (ulong)uVar5;
          if (uVar30 == 0) {
            BVar31 = 0xffffffffffffffff;
          }
          else {
            lVar32 = uVar30 + 1;
            uVar23 = 0;
            do {
              uVar36 = 1L << ((byte)pIVar16->aiColumn[lVar32 + -2] & 0x3f);
              if (0x3e < (ushort)pIVar16->aiColumn[lVar32 + -2]) {
                uVar36 = 0;
              }
              uVar23 = uVar23 | uVar36;
              lVar32 = lVar32 + -1;
            } while (1 < lVar32);
            BVar31 = ~uVar23;
          }
          pIVar16->colNotIdxed = BVar31;
          if ((pTblName != (SrcList *)0x0) && ((int)pTVar15->nCol <= (int)(uint)uVar5)) {
            uVar6 = *(ushort *)&pIVar16->field_0x63;
            *(ushort *)&pIVar16->field_0x63 = uVar6 | 0x20;
            if (0 < pTVar15->nCol) {
              iVar13 = 0;
              do {
                if (iVar13 != pTVar15->iPKey) {
                  if (uVar30 != 0) {
                    uVar23 = 0;
                    while (pIVar16->aiColumn[uVar23] != (short)iVar13) {
                      uVar23 = uVar23 + 1;
                      if ((uint)uVar5 == uVar23) goto LAB_0015d682;
                    }
                    if (-1 < (short)uVar23) goto LAB_0015d678;
                  }
LAB_0015d682:
                  *(ushort *)&pIVar16->field_0x63 = uVar6 & 0xffdf;
                  break;
                }
LAB_0015d678:
                iVar13 = iVar13 + 1;
              } while (iVar13 != pTVar15->nCol);
            }
          }
          if (pTVar15 == pParse->pNewTable) {
            pIVar27 = pTVar15->pIndex;
            if (pIVar27 == (Index *)0x0) {
              bVar39 = true;
            }
            else {
              do {
                uVar5 = pIVar27->nKeyCol;
                iVar13 = 0x14;
                if (uVar5 == pIVar16->nKeyCol) {
                  uVar30 = 0;
                  uVar37 = (uint)uVar5;
                  if (uVar37 != 0) {
                    piVar9 = pIVar27->aiColumn;
                    piVar10 = pIVar16->aiColumn;
                    uVar30 = 0;
                    do {
                      if ((piVar9[uVar30] != piVar10[uVar30]) ||
                         (iVar13 = sqlite3StrICmp(pIVar27->azColl[uVar30],pIVar16->azColl[uVar30]),
                         iVar13 != 0)) goto LAB_0015d736;
                      uVar30 = uVar30 + 1;
                    } while (uVar37 != uVar30);
                    uVar30 = (ulong)uVar37;
                  }
LAB_0015d736:
                  if ((uint)uVar30 == (uint)uVar5) {
                    if (pIVar27->onError != pIVar16->onError) {
                      if ((pIVar27->onError != '\v') && (pIVar16->onError != '\v')) {
                        sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                      }
                      if (pIVar27->onError == '\v') {
                        pIVar27->onError = pIVar16->onError;
                      }
                    }
                    if (idxType == '\x02') {
                      *(ushort *)&pIVar27->field_0x63 = *(ushort *)&pIVar27->field_0x63 & 0xfffc | 2
                      ;
                    }
                    if (1 < pParse->eParseMode) {
                      pIVar16->pNext = pParse->pNewIndex;
                      pParse->pNewIndex = pIVar16;
                      pIVar16 = (Index *)0x0;
                    }
                    iVar13 = 2;
                  }
                  else {
                    iVar13 = 0;
                  }
                }
                if ((iVar13 != 0x14) && (iVar13 != 0)) goto LAB_0015d7d4;
                pIVar27 = pIVar27->pNext;
              } while (pIVar27 != (Index *)0x0);
              iVar13 = 0;
LAB_0015d7d4:
              bVar39 = iVar13 == 0;
            }
            if (bVar39) goto LAB_0015d7e5;
          }
          else {
LAB_0015d7e5:
            if (pParse->eParseMode < 2) {
              if ((db->init).busy == '\0') {
                if ((pTblName != (SrcList *)0x0) || ((pTVar15->tabFlags & 0x20) == 0)) {
                  uVar37 = pParse->nMem + 1;
                  pParse->nMem = uVar37;
                  p = sqlite3GetVdbe(pParse);
                  if (p == (Vdbe *)0x0) goto LAB_0015d8d7;
                  sqlite3BeginWriteOperation(pParse,1,iVar12);
                  local_d0 = (char *)0x0;
                  iVar13 = sqlite3VdbeAddOp3(p,0xaa,0,0,0);
                  pIVar16->tnum = iVar13;
                  sqlite3VdbeAddOp3(p,0x8b,iVar12,uVar37,2);
                  if (pStart != (Token *)0x0) {
                    iVar13 = (*(int *)&(pParse->sLastToken).z - (int)local_78->z) +
                             (pParse->sLastToken).n;
                    pcVar34 = " UNIQUE";
                    if (onError == 0) {
                      pcVar34 = "";
                    }
                    local_d0 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar34,
                                              (ulong)(iVar13 - (uint)(local_78->z[(long)iVar13 + -1]
                                                                     == ';')));
                  }
                  sqlite3NestedParse(pParse,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                     *(undefined8 *)((long)&db->aDb->zDbSName + local_80),
                                     "sqlite_master",pIVar16->zName,pTVar15->zName,(ulong)uVar37,
                                     local_d0);
                  if (local_d0 != (char *)0x0) {
                    sqlite3DbFreeNN(db,local_d0);
                  }
                  if (pTblName != (SrcList *)0x0) {
                    sqlite3RefillIndex(pParse,pIVar16,uVar37);
                    sqlite3ChangeCookie(pParse,iVar12);
                    pcVar34 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar16->zName);
                    sqlite3VdbeAddParseSchemaOp(p,iVar12,pcVar34);
                    sqlite3VdbeAddOp3(p,0x9e,0,1,0);
                  }
                  if (p->db->mallocFailed == '\0') {
                    iVar12 = p->nOp + -1;
                    if (-1 < pIVar16->tnum) {
                      iVar12 = pIVar16->tnum;
                    }
                    pOVar28 = p->aOp + iVar12;
                  }
                  else {
                    pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
                  }
                  pOVar28->p2 = p->nOp;
                }
              }
              else {
                if (pTblName != (SrcList *)0x0) {
                  iVar12 = (db->init).newTnum;
                  pIVar16->tnum = iVar12;
                  for (pIVar27 = pIVar16->pTable->pIndex; pIVar27 != (Index *)0x0;
                      pIVar27 = pIVar27->pNext) {
                    if ((pIVar27 != pIVar16) && (pIVar27->tnum == iVar12)) {
                      sqlite3ErrorMsg(pParse,"invalid rootpage");
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1af0d,
                                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50"
                                 );
                      pParse->rc = 0xb;
                      goto LAB_0015d8d7;
                    }
                  }
                }
                pvVar25 = sqlite3HashInsert(&pIVar16->pSchema->idxHash,pIVar16->zName,pIVar16);
                if (pvVar25 != (void *)0x0) {
                  sqlite3OomFault(db);
                  goto LAB_0015d8d7;
                }
                *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
              }
            }
            if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
              if ((onError == 5) &&
                 ((pIVar27 = pTVar15->pIndex, pIVar27 != (Index *)0x0 &&
                  (pIVar27->onError != '\x05')))) {
                do {
                  pIVar24 = pIVar27;
                  pIVar27 = pIVar24->pNext;
                  if (pIVar27 == (Index *)0x0) break;
                } while (pIVar27->onError != '\x05');
                pIVar16->pNext = pIVar27;
                pIVar24->pNext = pIVar16;
              }
              else {
                pIVar16->pNext = pTVar15->pIndex;
                pTVar15->pIndex = pIVar16;
              }
            }
            else {
              if (pParse->eParseMode < 2) goto LAB_0015d8d7;
              pParse->pNewIndex = pIVar16;
            }
            pIVar16 = (Index *)0x0;
          }
LAB_0015d8d7:
          pPIWhere = (Expr *)0x0;
          pList = local_c0;
          goto LAB_0015cbe4;
        }
      }
    }
    else {
      pcVar34 = "views may not be indexed";
LAB_0015ce58:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar34);
    }
  }
  else {
LAB_0015cbdf:
    zName = (char *)0x0;
  }
LAB_0015cbe2:
  pIVar16 = (Index *)0x0;
LAB_0015cbe4:
  if (pIVar16 != (Index *)0x0) {
    sqlite3FreeIndex(db,pIVar16);
  }
  if (pPIWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pPIWhere);
  }
  if (pList != (ExprList *)0x0) {
    exprListDeleteNN(db,pList);
  }
  sqlite3SrcListDelete(db,pTblName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  if( db->mallocFailed || pParse->nErr>0 ){
    goto exit_create_index;
  }
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
       && pTblName!=0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
#ifdef SQLITE_ALLOW_SQLITE_MASTER_INDEX
       && sqlite3StrICmp(&pTab->zName[7],"master")!=0
#endif
 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, 0)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else if( pTab->aCol[j].notNull==0 ){
        pIndex->uniqNotNull = 0;
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = pTab->aCol[j].zColl;
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab) 
      || pTab->iPKey<0 || sqlite3ColumnOfIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3ColumnOfIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures. 
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_master table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_master
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in 
      ** Index.tnum. This is required in case this index is actually a 
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In 
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_master for this index
      */
      sqlite3NestedParse(pParse, 
          "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
          db->aDb[iDb].zDbSName, MASTER_NAME,
          pIndex->zName,
          pTab->zName,
          iMem,
          zStmt
          );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, pIndex->tnum);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}